

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::WriteTLASCompactedSize
          (DeviceContextVkImpl *this,WriteTLASCompactedSizeAttribs *Attribs)

{
  VulkanCommandBuffer *this_00;
  Uint32 *pUVar1;
  TopLevelASVkImpl *TLAS;
  BufferVkImpl *Buffer;
  VkQueryPool queryPool;
  VkBuffer dstBuffer;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::WriteTLASCompactedSize
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  TLAS = (TopLevelASVkImpl *)Attribs->pTLAS;
  if (TLAS != (TopLevelASVkImpl *)0x0) {
    CheckDynamicType<Diligent::TopLevelASVkImpl,Diligent::ITopLevelAS>((ITopLevelAS *)TLAS);
  }
  Buffer = (BufferVkImpl *)Attribs->pDestBuffer;
  if (Buffer != (BufferVkImpl *)0x0) {
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)Buffer);
  }
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyTLASState
            (this,TLAS,Attribs->TLASTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
             "Write AS compacted size (DeviceContextVkImpl::WriteTLASCompactedSize)");
  TransitionOrVerifyBufferState
            (this,Buffer,Attribs->BufferTransitionMode,RESOURCE_STATE_COPY_DEST,
             VK_ACCESS_TRANSFER_WRITE_BIT,
             "Write AS compacted size (DeviceContextVkImpl::WriteTLASCompactedSize)");
  this_00 = &this->m_CommandBuffer;
  VulkanUtilities::VulkanCommandBuffer::ResetQueryPool(this_00,(this->m_ASQueryPool).m_VkObject,0,1)
  ;
  VulkanUtilities::VulkanCommandBuffer::WriteAccelerationStructuresProperties
            (this_00,(TLAS->m_VulkanTLAS).m_VkObject,
             VK_QUERY_TYPE_ACCELERATION_STRUCTURE_COMPACTED_SIZE_KHR,
             (this->m_ASQueryPool).m_VkObject,0);
  queryPool = (this->m_ASQueryPool).m_VkObject;
  dstBuffer = BufferVkImpl::GetVkBuffer(Buffer);
  VulkanUtilities::VulkanCommandBuffer::CopyQueryPoolResults
            (this_00,queryPool,0,1,dstBuffer,Attribs->DestBufferOffset,8,3);
  pUVar1 = &(this->m_State).NumCommands;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::WriteTLASCompactedSize(const WriteTLASCompactedSizeAttribs& Attribs)
{
    TDeviceContextBase::WriteTLASCompactedSize(Attribs, 0);

    const Uint32      QueryIndex  = 0;
    TopLevelASVkImpl* pTLASVk     = ClassPtrCast<TopLevelASVkImpl>(Attribs.pTLAS);
    BufferVkImpl*     pDestBuffVk = ClassPtrCast<BufferVkImpl>(Attribs.pDestBuffer);

    EnsureVkCmdBuffer();

    const char* OpName = "Write AS compacted size (DeviceContextVkImpl::WriteTLASCompactedSize)";
    TransitionOrVerifyTLASState(*pTLASVk, Attribs.TLASTransitionMode, RESOURCE_STATE_BUILD_AS_READ, OpName);
    TransitionOrVerifyBufferState(*pDestBuffVk, Attribs.BufferTransitionMode, RESOURCE_STATE_COPY_DEST, VK_ACCESS_TRANSFER_WRITE_BIT, OpName);

    m_CommandBuffer.ResetQueryPool(m_ASQueryPool, QueryIndex, 1);
    m_CommandBuffer.WriteAccelerationStructuresProperties(pTLASVk->GetVkTLAS(), VK_QUERY_TYPE_ACCELERATION_STRUCTURE_COMPACTED_SIZE_KHR, m_ASQueryPool, QueryIndex);
    m_CommandBuffer.CopyQueryPoolResults(m_ASQueryPool, QueryIndex, 1, pDestBuffVk->GetVkBuffer(), Attribs.DestBufferOffset, sizeof(Uint64), VK_QUERY_RESULT_64_BIT | VK_QUERY_RESULT_WAIT_BIT);
    ++m_State.NumCommands;
}